

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
::perform_special_key
          (ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
           *this,Key key)

{
  size_t in_RCX;
  Key key_local;
  ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
  *this_local;
  
  if (key == KeyJasminReset) {
    Jasmin::write(&this->jasmin_,0x3fa,(void *)0x0,in_RCX);
    Jasmin::write(&this->jasmin_,0x3fb,(void *)0x1,in_RCX);
    CPU::WDC65816::ProcessorBase::set_power_on((ProcessorBase *)&this->m6502_,true);
  }
  else if (key == KeyNMI) {
    CPU::WDC65816::ProcessorBase::set_nmi_line((ProcessorBase *)&this->m6502_,true);
    CPU::WDC65816::ProcessorBase::set_nmi_line((ProcessorBase *)&this->m6502_,false);
  }
  return;
}

Assistant:

void perform_special_key(Oric::Key key) final {
			switch(key) {
				default: break;

				case KeyJasminReset:
					jasmin_.write(0x3fa, 0);
					jasmin_.write(0x3fb, 1);
					m6502_.set_power_on(true);
				break;

				case KeyNMI:
					// As luck would have it, the 6502's NMI line is edge triggered.
					// So just forcing through an edge will work here.
					m6502_.set_nmi_line(true);
					m6502_.set_nmi_line(false);
				break;
			}
		}